

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O3

void png_write_flush(png_structrp png_ptr)

{
  if ((png_ptr != (png_structrp)0x0) && (png_ptr->row_number < png_ptr->num_rows)) {
    png_compress_IDAT(png_ptr,(png_const_bytep)0x0,0,2);
    png_ptr->flush_rows = 0;
    png_flush(png_ptr);
    return;
  }
  return;
}

Assistant:

void PNGAPI
png_write_flush(png_structrp png_ptr)
{
   png_debug(1, "in png_write_flush");

   if (png_ptr == NULL)
      return;

   /* We have already written out all of the data */
   if (png_ptr->row_number >= png_ptr->num_rows)
      return;

   png_compress_IDAT(png_ptr, NULL, 0, Z_SYNC_FLUSH);
   png_ptr->flush_rows = 0;
   png_flush(png_ptr);
}